

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  reference ppSVar2;
  cmFileLockResult cVar3;
  _Self local_40;
  _Self local_38;
  It i_1;
  _Self local_28;
  It i;
  string *filename_local;
  cmFileLockPool *this_local;
  cmFileLockResult result;
  
  i._M_node = (_List_node_base *)filename;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
       ::begin(&this->FunctionScopes);
  while( true ) {
    i_1._M_node = (_List_node_base *)
                  std::__cxx11::
                  list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
                  end(&this->FunctionScopes);
    bVar1 = std::operator!=(&local_28,&i_1);
    if (!bVar1) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::begin
                     (&this->FileScopes);
      while( true ) {
        local_40._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::end
                       (&this->FileScopes);
        bVar1 = std::operator!=(&local_38,&local_40);
        if (!bVar1) {
          cVar3 = ScopePool::Release(&this->ProcessScope,(string *)i._M_node);
          return cVar3;
        }
        ppSVar2 = std::_List_iterator<cmFileLockPool::ScopePool_*>::operator*(&local_38);
        this_local = (cmFileLockPool *)ScopePool::Release(*ppSVar2,(string *)i._M_node);
        bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
        if (!bVar1) break;
        std::_List_iterator<cmFileLockPool::ScopePool_*>::operator++(&local_38);
      }
      return (cmFileLockResult)this_local;
    }
    ppSVar2 = std::_List_iterator<cmFileLockPool::ScopePool_*>::operator*(&local_28);
    this_local = (cmFileLockPool *)ScopePool::Release(*ppSVar2,(string *)i._M_node);
    bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
    if (!bVar1) break;
    std::_List_iterator<cmFileLockPool::ScopePool_*>::operator++(&local_28);
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (It i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk())
      {
      return result;
      }
    }

  for (It i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk())
      {
      return result;
      }
    }

  return this->ProcessScope.Release(filename);
}